

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::MidSideNodeIndices
          (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,int side,
          TPZVec<long> *indices)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  TPZGeoElSideIndex *pTVar5;
  int64_t iVar6;
  TPZManVector<TPZGeoElSide,_10> *pTVar7;
  undefined4 extraout_var;
  long *plVar8;
  TPZVec<long> *in_RDX;
  int in_ESI;
  long *in_RDI;
  TPZGeoEl *subel;
  int64_t counter;
  int64_t is;
  int64_t nsub;
  TPZVec<TPZGeoElSideIndex> nodeIndexes;
  TPZManVector<TPZGeoElSide,_10> gelsides;
  TPZAutoPointer<TPZRefPattern> *in_stack_fffffffffffffe50;
  TPZManVector<TPZGeoElSide,_10> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  long local_178;
  int64_t local_170;
  TPZAutoPointer<TPZRefPattern> local_160 [2];
  TPZVec<TPZGeoElSideIndex> *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  TPZRefPattern *in_stack_fffffffffffffec0;
  int64_t in_stack_fffffffffffffee8;
  TPZManVector<TPZGeoElSide,_10> *in_stack_fffffffffffffef0;
  
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x31));
  if (((bVar1) && (iVar2 = (**(code **)(*in_RDI + 0x1d0))(), iVar2 != 0)) &&
     (iVar2 = (**(code **)(*in_RDI + 0x98))(), iVar2 <= in_ESI)) {
    TPZManVector<TPZGeoElSide,_10>::TPZManVector
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    TPZVec<TPZGeoElSideIndex>::TPZVec((TPZVec<TPZGeoElSideIndex> *)&stack0xfffffffffffffeb8);
    (**(code **)(*in_RDI + 0x2b0))(local_160);
    TPZAutoPointer<TPZRefPattern>::operator->(local_160);
    TPZRefPattern::InternalNodesIndexes
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0);
    TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(in_stack_fffffffffffffe50);
    iVar4 = TPZVec<TPZGeoElSideIndex>::NElements
                      ((TPZVec<TPZGeoElSideIndex> *)&stack0xfffffffffffffeb8);
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,iVar4);
    local_178 = 0;
    for (local_170 = 0; local_170 < iVar4; local_170 = local_170 + 1) {
      pTVar5 = TPZVec<TPZGeoElSideIndex>::operator[]
                         ((TPZVec<TPZGeoElSideIndex> *)&stack0xfffffffffffffeb8,local_170);
      iVar6 = TPZGeoElSideIndex::ElementIndex(pTVar5);
      pTVar7 = (TPZManVector<TPZGeoElSide,_10> *)
               (**(code **)(*in_RDI + 0x1f8))(in_RDI,(int)iVar6 + -1);
      in_stack_fffffffffffffe60 = pTVar7;
      pTVar5 = TPZVec<TPZGeoElSideIndex>::operator[]
                         ((TPZVec<TPZGeoElSideIndex> *)&stack0xfffffffffffffeb8,local_170);
      uVar3 = TPZGeoElSideIndex::Side(pTVar5);
      iVar2 = (*(pTVar7->super_TPZVec<TPZGeoElSide>)._vptr_TPZVec[0x15])(pTVar7,(ulong)uVar3);
      plVar8 = TPZVec<long>::operator[](in_RDX,local_178);
      *plVar8 = CONCAT44(extraout_var,iVar2);
      local_178 = local_178 + 1;
    }
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,local_178);
    TPZVec<TPZGeoElSideIndex>::~TPZVec
              ((TPZVec<TPZGeoElSideIndex> *)CONCAT44(in_ESI,in_stack_fffffffffffffe70));
    TPZManVector<TPZGeoElSide,_10>::~TPZManVector(in_stack_fffffffffffffe60);
  }
  else {
    (*in_RDX->_vptr_TPZVec[3])(in_RDX,0);
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::MidSideNodeIndices(int side,TPZVec<int64_t> &indices) const{
	if(!fRefPattern || !HasSubElement() || side < this->NCornerNodes()) {
		indices.Resize(0);
		return;
	}
	TPZManVector<TPZGeoElSide> gelsides;
	TPZVec<TPZGeoElSideIndex> nodeIndexes;
	this->GetRefPattern()->InternalNodesIndexes(side, nodeIndexes);
	
	int64_t nsub = nodeIndexes.NElements();
	indices.Resize(nsub);
	int64_t is;
	int64_t counter = 0;
	for(is=0; is<nsub; is++)
	{
		TPZGeoEl *subel = SubElement(nodeIndexes[is].ElementIndex() - 1);
		indices[counter] = subel->NodeIndex(nodeIndexes[is].Side());
		counter++;
	}
	indices.Resize(counter);
}